

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_op_iforloop(function *fn,int A,int pc,int step_one,int pc1)

{
  int pc1_local;
  int step_one_local;
  int pc_local;
  int A_local;
  function *fn_local;
  
  if (step_one == 0) {
    membuff_add_fstring(&fn->body,"i_%d += step_%d;\n",(ulong)(uint)A,(ulong)(uint)A);
  }
  else {
    membuff_add_fstring(&fn->body,"i_%d += 1;\n",(ulong)(uint)A);
  }
  membuff_add_fstring(&fn->body,
                      "if (i_%d <= limit_%d) {\n  ra = R(%d);\n  setivalue(ra, i_%d);\n  goto Lbc_%d;\n}\n"
                      ,(ulong)(uint)A,(ulong)(uint)A,(ulong)(A + 3),(ulong)(uint)A,pc,pc1);
  return;
}

Assistant:

static void emit_op_iforloop(struct function *fn, int A, int pc, int step_one, int pc1) {
  (void)pc1;
  if (!step_one) {
    membuff_add_fstring(&fn->body, "i_%d += step_%d;\n", A, A);
  }
  else {
    membuff_add_fstring(&fn->body, "i_%d += 1;\n", A);
  }
  membuff_add_fstring(&fn->body,
                      "if (i_%d <= limit_%d) {\n  ra = R(%d);\n  setivalue(ra, "
                      "i_%d);\n  goto Lbc_%d;\n}\n",
                      A, A, A + 3, A, pc);
}